

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::updatePrimal(HDual *this,HVector *DSE_Vector)

{
  reference pvVar1;
  HDualRHS *in_RSI;
  HDualRHS *in_RDI;
  double *pdVar2;
  HDualRHS *unaff_retaddr;
  double in_stack_00000030;
  HVector *in_stack_00000038;
  HDualRHS *in_stack_00000040;
  double dvx_wt_o_rowOut;
  double thisEdWt_1;
  double thisEdWt;
  double u_out;
  double l_out;
  double x_out;
  double local_60;
  HVector *in_stack_ffffffffffffffa8;
  HVector *column;
  double local_48;
  double local_40;
  double local_38;
  double Kai;
  double dVar3;
  HVector *column_00;
  HDualRHS *column_01;
  
  if (in_RDI[1].partNumCut == 0) {
    column_01 = in_RDI;
    HDualRHS::update_primal(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    HDualRHS::update_infeasList(in_RDI,in_stack_ffffffffffffffa8);
    column = *(HVector **)
              ((in_RDI->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + (long)*(int *)&in_RDI[9].workModel * 2);
    dVar3 = *(double *)
             ((in_RDI->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + (long)*(int *)&in_RDI[9].workModel * 2);
    Kai = *(double *)
           ((in_RDI->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish + (long)*(int *)&in_RDI[9].workModel * 2);
    local_60 = Kai;
    if (*(double *)&in_RDI[9].workCount <= 0.0 && *(double *)&in_RDI[9].workCount != 0.0) {
      local_60 = dVar3;
    }
    *(double *)&in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8
         = ((double)column - local_60) /
           *(double *)
            &in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    column_00 = column;
    HDualRHS::update_primal(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    if (*(int *)((long)&in_RDI->workModel + 4) == 0) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI[8].workEdWt,(long)*(int *)&in_RDI[9].workModel);
      pdVar2 = (double *)
               (*pvVar1 /
               (*(double *)
                 &in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x10 *
               *(double *)
                &in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 field_0x10));
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 &(in_RSI->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x8,0);
      HDualRHS::update_weight(in_RSI,column_00,dVar3,Kai,pdVar2);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI[8].workEdWt,(long)*(int *)&in_RDI[9].workModel);
      *pvVar1 = (value_type)pdVar2;
    }
    else if (*(int *)((long)&in_RDI->workModel + 4) == 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI[8].workEdWt,(long)*(int *)&in_RDI[9].workModel);
      local_38 = *pvVar1 / (*(double *)
                             &in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.field_0x10 *
                           *(double *)
                            &in_RDI[9].workMark.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.field_0x10);
      local_48 = 1.0;
      pdVar2 = std::max<double>(&local_48,&local_38);
      local_40 = *pdVar2;
      HDualRHS::update_weight_Dvx(unaff_retaddr,(HVector *)column_01,(double)in_RSI);
      dVar3 = local_40;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI[8].workEdWt,(long)*(int *)&in_RDI[9].workModel);
      *pvVar1 = dVar3;
      *(int *)((long)&(in_RDI->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) =
           *(int *)((long)&(in_RDI->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + 4) + 1;
    }
    HDualRHS::update_infeasList(in_RDI,column);
    if (*(int *)((long)&in_RDI->workModel + 4) == 0) {
      in_RDI[6].workEdWtFull.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((double)in_RDI[6].workEdWtFull.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish * 0.95 +
                    ((double)*(int *)((long)&in_RSI->workModel + 4) * 0.05) /
                    (double)*(int *)((long)&(in_RDI->workEdWtFull).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + 4));
    }
    in_RDI[6].workEdWtFull.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((double)in_RDI[6].workEdWtFull.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage * 0.95 +
                  ((double)in_RDI[3].partNumRow * 0.05) /
                  (double)*(int *)((long)&(in_RDI->workEdWtFull).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + 4));
    in_RDI[0x1b9].workIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(*(double *)&in_RDI[4].workCount +
                  (double)in_RDI[0x1b9].workIndex.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
    if (*(int *)((long)&in_RDI->workModel + 4) == 0) {
      in_RDI[0x1b9].workIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((double)(in_RSI->workIndex).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage +
                    (double)in_RDI[0x1b9].workIndex.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
    }
    in_RDI[0x1b9].workArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((double)*(int *)&in_RDI[4].workCutoff +
                  (double)in_RDI[0x1b9].workArray.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    if (*(int *)((long)&in_RDI->workModel + 4) == 0) {
      in_RDI[0x1b9].workArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((double)*(int *)&(in_RSI->workIndex).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish +
                    (double)in_RDI[0x1b9].workArray.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HDual::updatePrimal(HVector *DSE_Vector) {
	if (invertHint)
		return;
	// NB DSE_Vector is only computed if EdWt_Mode == EdWt_Mode_DSE
	// Update - primal and weight
	dualRHS.update_primal(&columnBFRT, 1);
	dualRHS.update_infeasList(&columnBFRT);
	double x_out = baseValue[rowOut];
	double l_out = baseLower[rowOut];
	double u_out = baseUpper[rowOut];
	thetaPrimal = (x_out - (deltaPrimal < 0 ? l_out : u_out)) / alpha;
	dualRHS.update_primal(&column, thetaPrimal);
	if (EdWt_Mode == EdWt_Mode_DSE) {
		double thisEdWt = dualRHS.workEdWt[rowOut] / (alpha * alpha);
		dualRHS.update_weight(&column, thisEdWt, -2 / alpha,
				&DSE_Vector->array[0]);
		dualRHS.workEdWt[rowOut] = thisEdWt;
	} else if (EdWt_Mode == EdWt_Mode_Dvx) {
//	Pivotal row is for the current basis: weights are required for the next basis
//  so have to divide the current (exact) weight by the pivotal value
		double thisEdWt = dualRHS.workEdWt[rowOut] / (alpha * alpha);
		double dvx_wt_o_rowOut = max(1.0, thisEdWt);
//       	      nw_wt  is max(workEdWt[iRow], NewExactWeight*columnArray[iRow]^2);
//				But NewExactWeight is dvx_wt_o_rowOut = max(1.0, dualRHS.workEdWt[rowOut] / (alpha * alpha)) so
//       	      nw_wt = max(workEdWt[iRow], dvx_wt_o_rowOut*columnArray[iRow]^2);
//	Update rest of weights
		dualRHS.update_weight_Dvx(&column, dvx_wt_o_rowOut);
		dualRHS.workEdWt[rowOut] = dvx_wt_o_rowOut;
		n_dvx_it += 1;
	}
	dualRHS.update_infeasList(&column);

	if (EdWt_Mode == EdWt_Mode_DSE) {
		rowdseDensity = 0.95 * rowdseDensity
				+ 0.05 * DSE_Vector->count / numRow;
	}
	columnDensity = 0.95 * columnDensity + 0.05 * column.count / numRow;

	total_fake += column.fakeTick;
	if (EdWt_Mode == EdWt_Mode_DSE) {
		total_fake += DSE_Vector->fakeTick;
	}
	total_FT_inc_TICK += column.pseudoTick;
	if (EdWt_Mode == EdWt_Mode_DSE) {
		total_FT_inc_TICK += DSE_Vector->pseudoTick;
	}
}